

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_connect_step1(connectdata *conn,int sockindex)

{
  byte bVar1;
  SSL_METHOD SVar2;
  ssl_config_data *psVar3;
  SSL_METHOD *pSVar4;
  _Bool _Var5;
  CURLcode CVar6;
  int iVar7;
  int idx;
  SSL_CTX *pSVar8;
  ulong uVar9;
  char *pcVar10;
  X509_STORE *pXVar11;
  X509_LOOKUP_METHOD *m;
  SSL *pSVar12;
  long lVar13;
  BIO_METHOD *type;
  BIO *bp;
  bool bVar14;
  char *local_368;
  char *local_358;
  char *local_348;
  char *local_338;
  char *local_328;
  Curl_easy *local_320;
  char *local_318;
  char *local_308;
  char *local_2f8;
  char *local_2b8;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  ulong local_288;
  long *local_280;
  char *local_278;
  SSL *handle;
  BIO *bio;
  int sockindex_idx;
  int connectdata_idx;
  void *ssl_sessionid;
  char *ciphers13;
  uchar protocols [128];
  char local_1b8 [4];
  int cur;
  char error_buffer [256];
  char *ssl_crlfile;
  _Bool verifypeer;
  char *ssl_capath;
  char *ssl_cafile;
  char *ssl_cert_type;
  char *ssl_cert;
  long ssl_version;
  long *certverifyresult;
  in6_addr addr;
  char *hostname;
  ulong uStack_58;
  _Bool sni;
  long ctx_options;
  ssl_connect_data *connssl;
  X509_LOOKUP *pXStack_40;
  curl_socket_t sockfd;
  X509_LOOKUP *lookup;
  SSL_METHOD *req_method;
  Curl_easy *data;
  char *ciphers;
  CURLcode result;
  int sockindex_local;
  connectdata *conn_local;
  
  ciphers._0_4_ = 0;
  req_method = (SSL_METHOD *)conn->data;
  lookup = (X509_LOOKUP *)0x0;
  pXStack_40 = (X509_LOOKUP *)0x0;
  connssl._4_4_ = conn->sock[sockindex];
  ctx_options = (long)(conn->ssl + sockindex);
  uStack_58 = 0;
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_278 = (conn->http_proxy).host.name;
  }
  else {
    local_278 = (conn->host).name;
  }
  addr.__in6_u._8_8_ = local_278;
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    psVar3 = &(((Curl_easy *)req_method)->set).proxy_ssl;
  }
  else {
    psVar3 = &(((Curl_easy *)req_method)->set).ssl;
  }
  local_280 = &psVar3->certverifyresult;
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_288 = (conn->proxy_ssl_config).version;
  }
  else {
    local_288 = (conn->ssl_config).version;
  }
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_290 = (((Curl_easy *)req_method)->set).proxy_ssl.cert;
  }
  else {
    local_290 = (((Curl_easy *)req_method)->set).ssl.cert;
  }
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_298 = (((Curl_easy *)req_method)->set).proxy_ssl.cert_type;
  }
  else {
    local_298 = (((Curl_easy *)req_method)->set).ssl.cert_type;
  }
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_2a0 = (conn->proxy_ssl_config).CAfile;
  }
  else {
    local_2a0 = (conn->ssl_config).CAfile;
  }
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_2a8 = (conn->proxy_ssl_config).CApath;
  }
  else {
    local_2a8 = (conn->ssl_config).CApath;
  }
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    bVar1 = (conn->proxy_ssl_config).field_0x48;
  }
  else {
    bVar1 = (conn->ssl_config).field_0x48;
  }
  bVar14 = (bVar1 & 1) != 0;
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_2b8 = (((Curl_easy *)req_method)->set).proxy_ssl.CRLfile;
  }
  else {
    local_2b8 = (((Curl_easy *)req_method)->set).ssl.CRLfile;
  }
  error_buffer._248_8_ = local_2b8;
  ciphers._4_4_ = sockindex;
  _result = conn;
  ciphers._0_4_ = Curl_ossl_seed((Curl_easy *)req_method);
  if ((CURLcode)ciphers != CURLE_OK) {
    return (CURLcode)ciphers;
  }
  *local_280 = 1;
  if (1 < local_288) {
    if (local_288 == 2) {
      Curl_failf((Curl_easy *)req_method,"OpenSSL was built without SSLv2 support");
      return CURLE_NOT_BUILT_IN;
    }
    if (local_288 == 3) {
      Curl_failf((Curl_easy *)req_method,"OpenSSL was built without SSLv3 support");
      return CURLE_NOT_BUILT_IN;
    }
    if (3 < local_288 - 4) {
      Curl_failf((Curl_easy *)req_method,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
      return CURLE_SSL_CONNECT_ERROR;
    }
  }
  lookup = (X509_LOOKUP *)TLS_client_method();
  if (**(long **)(ctx_options + 8) != 0) {
    SSL_CTX_free((SSL_CTX *)**(undefined8 **)(ctx_options + 8));
  }
  pSVar8 = SSL_CTX_new((SSL_METHOD *)lookup);
  pSVar4 = req_method;
  **(undefined8 **)(ctx_options + 8) = pSVar8;
  if (**(long **)(ctx_options + 8) == 0) {
    uVar9 = ERR_peek_error();
    pcVar10 = ossl_strerror(uVar9,local_1b8,0x100);
    Curl_failf((Curl_easy *)pSVar4,"SSL: couldn\'t create a context: %s",pcVar10);
    return CURLE_OUT_OF_MEMORY;
  }
  SSL_CTX_ctrl((SSL_CTX *)**(undefined8 **)(ctx_options + 8),0x21,0x10,(void *)0x0);
  if ((*(long *)(req_method + 0x730) != 0) && ((*(ulong *)(req_method + 0xee0) >> 0x1e & 1) != 0)) {
    SSL_CTX_set_msg_callback((SSL_CTX *)**(undefined8 **)(ctx_options + 8),ssl_tls_trace);
    SSL_CTX_ctrl((SSL_CTX *)**(undefined8 **)(ctx_options + 8),0x10,0,_result);
  }
  if (((_result->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete)) {
    SVar2 = req_method[0xb90];
  }
  else {
    SVar2 = req_method[0xae8];
  }
  uStack_58 = 0x80024850;
  if (((byte)SVar2 >> 2 & 1) == 0) {
    uStack_58 = 0x80024050;
  }
  if (1 < local_288) {
    if (local_288 == 2) {
      uStack_58 = uStack_58 | 0x3e000000;
      goto LAB_007a0ec9;
    }
    if (local_288 == 3) {
      uStack_58 = uStack_58 | 0x3c000000;
      goto LAB_007a0ec9;
    }
    if (3 < local_288 - 4) {
      Curl_failf((Curl_easy *)req_method,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
      return CURLE_SSL_CONNECT_ERROR;
    }
  }
  uStack_58 = uStack_58 | 0x2000000;
  CVar6 = set_ssl_version_min_max((long *)&stack0xffffffffffffffa8,_result,ciphers._4_4_);
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
  ciphers._0_4_ = CURLE_OK;
LAB_007a0ec9:
  SSL_CTX_set_options(**(undefined8 **)(ctx_options + 8),uStack_58);
  if ((*(uint *)&(_result->bits).field_0x4 >> 0x1c & 1) != 0) {
    SSL_CTX_set_next_proto_select_cb
              ((SSL_CTX *)**(undefined8 **)(ctx_options + 8),select_next_proto_cb,_result);
  }
  if ((*(uint *)&(_result->bits).field_0x4 >> 0x1d & 1) != 0) {
    ciphers13._0_1_ = 8;
    ciphers13._1_1_ = 'h';
    ciphers13._2_1_ = 't';
    ciphers13._3_1_ = 't';
    ciphers13._4_1_ = 'p';
    ciphers13._5_1_ = '/';
    ciphers13._6_1_ = '1';
    ciphers13._7_1_ = '.';
    protocols[0] = '1';
    Curl_infof((Curl_easy *)req_method,"ALPN, offering %s\n","http/1.1");
    SSL_CTX_set_alpn_protos(**(undefined8 **)(ctx_options + 8),&ciphers13,9);
  }
  if ((local_290 != (char *)0x0) || (local_298 != (char *)0x0)) {
    if (((_result->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete)) {
      local_2f8 = *(char **)(req_method + 0xb78);
    }
    else {
      local_2f8 = *(char **)(req_method + 0xad0);
    }
    if (((_result->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete)) {
      local_308 = *(char **)(req_method + 0xb80);
    }
    else {
      local_308 = *(char **)(req_method + 0xad8);
    }
    if (((_result->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete)) {
      local_318 = *(char **)(req_method + 0xb88);
    }
    else {
      local_318 = *(char **)(req_method + 0xae0);
    }
    iVar7 = cert_stuff(_result,(SSL_CTX *)**(undefined8 **)(ctx_options + 8),local_290,local_298,
                       local_2f8,local_308,local_318);
    if (iVar7 == 0) {
      return CURLE_SSL_CERTPROBLEM;
    }
  }
  if (((_result->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete)) {
    local_320 = (Curl_easy *)(_result->proxy_ssl_config).cipher_list;
  }
  else {
    local_320 = (Curl_easy *)(_result->ssl_config).cipher_list;
  }
  data = local_320;
  if (local_320 == (Curl_easy *)0x0) {
    data = (Curl_easy *)0x0;
  }
  if (data != (Curl_easy *)0x0) {
    iVar7 = SSL_CTX_set_cipher_list((SSL_CTX *)**(undefined8 **)(ctx_options + 8),(char *)data);
    if (iVar7 == 0) {
      Curl_failf((Curl_easy *)req_method,"failed setting cipher list: %s",data);
      return CURLE_SSL_CIPHER;
    }
    Curl_infof((Curl_easy *)req_method,"Cipher selection: %s\n",data);
  }
  if (((_result->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete)) {
    local_328 = (_result->proxy_ssl_config).cipher_list13;
  }
  else {
    local_328 = (_result->ssl_config).cipher_list13;
  }
  ssl_sessionid = local_328;
  if (local_328 != (char *)0x0) {
    iVar7 = SSL_CTX_set_ciphersuites(**(undefined8 **)(ctx_options + 8),local_328);
    if (iVar7 == 0) {
      Curl_failf((Curl_easy *)req_method,"failed setting TLS 1.3 cipher suite: %s",ssl_sessionid);
      return CURLE_SSL_CIPHER;
    }
    Curl_infof((Curl_easy *)req_method,"TLS 1.3 cipher selection: %s\n",ssl_sessionid);
  }
  SSL_CTX_set_post_handshake_auth(**(undefined8 **)(ctx_options + 8));
  if ((local_2a0 != (char *)0x0) || (local_2a8 != (char *)0x0)) {
    iVar7 = SSL_CTX_load_verify_locations
                      ((SSL_CTX *)**(undefined8 **)(ctx_options + 8),local_2a0,local_2a8);
    if (iVar7 == 0) {
      if (bVar14) {
        if (local_2a0 == (char *)0x0) {
          local_338 = "none";
        }
        else {
          local_338 = local_2a0;
        }
        if (local_2a8 == (char *)0x0) {
          local_348 = "none";
        }
        else {
          local_348 = local_2a8;
        }
        Curl_failf((Curl_easy *)req_method,
                   "error setting certificate verify locations:\n  CAfile: %s\n  CApath: %s",
                   local_338,local_348);
        return CURLE_SSL_CACERT_BADFILE;
      }
      Curl_infof((Curl_easy *)req_method,
                 "error setting certificate verify locations, continuing anyway:\n");
    }
    else {
      Curl_infof((Curl_easy *)req_method,"successfully set certificate verify locations:\n");
    }
    if (local_2a0 == (char *)0x0) {
      local_358 = "none";
    }
    else {
      local_358 = local_2a0;
    }
    if (local_2a8 == (char *)0x0) {
      local_368 = "none";
    }
    else {
      local_368 = local_2a8;
    }
    Curl_infof((Curl_easy *)req_method,"  CAfile: %s\n  CApath: %s\n",local_358,local_368);
  }
  if (error_buffer._248_8_ != 0) {
    pXVar11 = SSL_CTX_get_cert_store((SSL_CTX *)**(undefined8 **)(ctx_options + 8));
    m = X509_LOOKUP_file();
    pXStack_40 = X509_STORE_add_lookup(pXVar11,m);
    if ((pXStack_40 == (X509_LOOKUP *)0x0) ||
       (iVar7 = X509_load_crl_file(pXStack_40,(char *)error_buffer._248_8_,1), iVar7 == 0)) {
      Curl_failf((Curl_easy *)req_method,"error loading CRL file: %s",error_buffer._248_8_);
      return CURLE_SSL_CRL_BADFILE;
    }
    Curl_infof((Curl_easy *)req_method,"successfully load CRL file:\n");
    pXVar11 = SSL_CTX_get_cert_store((SSL_CTX *)**(undefined8 **)(ctx_options + 8));
    X509_STORE_set_flags(pXVar11,0xc);
    Curl_infof((Curl_easy *)req_method,"  CRLfile: %s\n",error_buffer._248_8_);
  }
  SSL_CTX_set_verify((SSL_CTX *)**(undefined8 **)(ctx_options + 8),(uint)bVar14,(callback *)0x0);
  if (keylog_file_fp != (FILE *)0x0) {
    SSL_CTX_set_keylog_callback(**(undefined8 **)(ctx_options + 8),ossl_keylog_callback);
  }
  SSL_CTX_ctrl((SSL_CTX *)**(undefined8 **)(ctx_options + 8),0x2c,0x301,(void *)0x0);
  SSL_CTX_sess_set_new_cb((SSL_CTX *)**(undefined8 **)(ctx_options + 8),ossl_new_session_cb);
  if (*(long *)(req_method + 0xab0) != 0) {
    ciphers._0_4_ =
         (**(code **)(req_method + 0xab0))
                   (req_method,**(undefined8 **)(ctx_options + 8),
                    *(undefined8 *)(req_method + 0xab8));
    if ((CURLcode)ciphers != CURLE_OK) {
      Curl_failf((Curl_easy *)req_method,"error signaled by ssl ctx callback");
      return (CURLcode)ciphers;
    }
    ciphers._0_4_ = CURLE_OK;
  }
  if (*(long *)(*(long *)(ctx_options + 8) + 8) != 0) {
    SSL_free(*(SSL **)(*(long *)(ctx_options + 8) + 8));
  }
  pSVar12 = SSL_new((SSL_CTX *)**(undefined8 **)(ctx_options + 8));
  *(SSL **)(*(long *)(ctx_options + 8) + 8) = pSVar12;
  if (*(long *)(*(long *)(ctx_options + 8) + 8) == 0) {
    Curl_failf((Curl_easy *)req_method,"SSL: couldn\'t create a context (handle)!");
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    if (((_result->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete)) {
      bVar1 = (_result->proxy_ssl_config).field_0x48;
    }
    else {
      bVar1 = (_result->ssl_config).field_0x48;
    }
    if ((bVar1 >> 2 & 1) != 0) {
      SSL_ctrl(*(SSL **)(*(long *)(ctx_options + 8) + 8),0x41,1,(void *)0x0);
    }
    SSL_set_connect_state(*(SSL **)(*(long *)(ctx_options + 8) + 8));
    *(undefined8 *)(*(long *)(ctx_options + 8) + 0x10) = 0;
    iVar7 = inet_pton(2,(char *)addr.__in6_u._8_8_,&certverifyresult);
    if (((iVar7 == 0) &&
        (iVar7 = inet_pton(10,(char *)addr.__in6_u._8_8_,&certverifyresult), iVar7 == 0)) &&
       (lVar13 = SSL_ctrl(*(SSL **)(*(long *)(ctx_options + 8) + 8),0x37,0,
                          (void *)addr.__in6_u._8_8_), lVar13 == 0)) {
      Curl_infof((Curl_easy *)req_method,
                 "WARNING: failed to configure server name indication (SNI) TLS extension\n");
    }
    if (((_result->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete)) {
      SVar2 = req_method[0xb38];
    }
    else {
      SVar2 = req_method[0xa90];
    }
    if (((byte)SVar2 >> 3 & 1) != 0) {
      _sockindex_idx = (SSL_SESSION *)0x0;
      iVar7 = ossl_get_ssl_conn_index();
      idx = ossl_get_ssl_sockindex_index();
      if ((-1 < iVar7) && (-1 < idx)) {
        SSL_set_ex_data(*(SSL **)(*(long *)(ctx_options + 8) + 8),iVar7,_result);
        SSL_set_ex_data(*(SSL **)(*(long *)(ctx_options + 8) + 8),idx,_result->sock + ciphers._4_4_)
        ;
      }
      Curl_ssl_sessionid_lock(_result);
      _Var5 = Curl_ssl_getsessionid(_result,(void **)&sockindex_idx,(size_t *)0x0,ciphers._4_4_);
      if (!_Var5) {
        iVar7 = SSL_set_session(*(SSL **)(*(long *)(ctx_options + 8) + 8),_sockindex_idx);
        if (iVar7 == 0) {
          Curl_ssl_sessionid_unlock(_result);
          pSVar4 = req_method;
          uVar9 = ERR_get_error();
          pcVar10 = ossl_strerror(uVar9,local_1b8,0x100);
          Curl_failf((Curl_easy *)pSVar4,"SSL: SSL_set_session failed: %s",pcVar10);
          return CURLE_SSL_CONNECT_ERROR;
        }
        Curl_infof((Curl_easy *)req_method,"SSL re-using session ID\n");
      }
      Curl_ssl_sessionid_unlock(_result);
    }
    if ((_result->proxy_ssl[ciphers._4_4_].field_0x10 & 1) == 0) {
      iVar7 = SSL_set_fd(*(SSL **)(*(long *)(ctx_options + 8) + 8),connssl._4_4_);
      pSVar4 = req_method;
      if (iVar7 == 0) {
        uVar9 = ERR_get_error();
        pcVar10 = ossl_strerror(uVar9,local_1b8,0x100);
        Curl_failf((Curl_easy *)pSVar4,"SSL: SSL_set_fd failed: %s",pcVar10);
        return CURLE_SSL_CONNECT_ERROR;
      }
    }
    else {
      type = BIO_f_ssl();
      bp = BIO_new(type);
      BIO_ctrl(bp,0x6d,0,(_result->proxy_ssl[ciphers._4_4_].backend)->handle);
      SSL_set_bio(*(SSL **)(*(long *)(ctx_options + 8) + 8),bp,bp);
    }
    *(undefined4 *)(ctx_options + 4) = 1;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode ossl_connect_step1(struct connectdata *conn, int sockindex)
{
  CURLcode result = CURLE_OK;
  char *ciphers;
  struct Curl_easy *data = conn->data;
  SSL_METHOD_QUAL SSL_METHOD *req_method = NULL;
  X509_LOOKUP *lookup = NULL;
  curl_socket_t sockfd = conn->sock[sockindex];
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  long ctx_options = 0;
#ifdef SSL_CTRL_SET_TLSEXT_HOSTNAME
  bool sni;
  const char * const hostname = SSL_IS_PROXY() ? conn->http_proxy.host.name :
    conn->host.name;
#ifdef ENABLE_IPV6
  struct in6_addr addr;
#else
  struct in_addr addr;
#endif
#endif
  long * const certverifyresult = SSL_IS_PROXY() ?
    &data->set.proxy_ssl.certverifyresult : &data->set.ssl.certverifyresult;
  const long int ssl_version = SSL_CONN_CONFIG(version);
#ifdef USE_TLS_SRP
  const enum CURL_TLSAUTH ssl_authtype = SSL_SET_OPTION(authtype);
#endif
  char * const ssl_cert = SSL_SET_OPTION(cert);
  const char * const ssl_cert_type = SSL_SET_OPTION(cert_type);
  const char * const ssl_cafile = SSL_CONN_CONFIG(CAfile);
  const char * const ssl_capath = SSL_CONN_CONFIG(CApath);
  const bool verifypeer = SSL_CONN_CONFIG(verifypeer);
  const char * const ssl_crlfile = SSL_SET_OPTION(CRLfile);
  char error_buffer[256];

  DEBUGASSERT(ssl_connect_1 == connssl->connecting_state);

  /* Make funny stuff to get random input */
  result = Curl_ossl_seed(data);
  if(result)
    return result;

  *certverifyresult = !X509_V_OK;

  /* check to see if we've been told to use an explicit SSL/TLS version */

  switch(ssl_version) {
  case CURL_SSLVERSION_DEFAULT:
  case CURL_SSLVERSION_TLSv1:
  case CURL_SSLVERSION_TLSv1_0:
  case CURL_SSLVERSION_TLSv1_1:
  case CURL_SSLVERSION_TLSv1_2:
  case CURL_SSLVERSION_TLSv1_3:
    /* it will be handled later with the context options */
#if (OPENSSL_VERSION_NUMBER >= 0x10100000L)
    req_method = TLS_client_method();
#else
    req_method = SSLv23_client_method();
#endif
    use_sni(TRUE);
    break;
  case CURL_SSLVERSION_SSLv2:
#ifdef OPENSSL_NO_SSL2
    failf(data, OSSL_PACKAGE " was built without SSLv2 support");
    return CURLE_NOT_BUILT_IN;
#else
#ifdef USE_TLS_SRP
    if(ssl_authtype == CURL_TLSAUTH_SRP)
      return CURLE_SSL_CONNECT_ERROR;
#endif
    req_method = SSLv2_client_method();
    use_sni(FALSE);
    break;
#endif
  case CURL_SSLVERSION_SSLv3:
#ifdef OPENSSL_NO_SSL3_METHOD
    failf(data, OSSL_PACKAGE " was built without SSLv3 support");
    return CURLE_NOT_BUILT_IN;
#else
#ifdef USE_TLS_SRP
    if(ssl_authtype == CURL_TLSAUTH_SRP)
      return CURLE_SSL_CONNECT_ERROR;
#endif
    req_method = SSLv3_client_method();
    use_sni(FALSE);
    break;
#endif
  default:
    failf(data, "Unrecognized parameter passed via CURLOPT_SSLVERSION");
    return CURLE_SSL_CONNECT_ERROR;
  }

  if(BACKEND->ctx)
    SSL_CTX_free(BACKEND->ctx);
  BACKEND->ctx = SSL_CTX_new(req_method);

  if(!BACKEND->ctx) {
    failf(data, "SSL: couldn't create a context: %s",
          ossl_strerror(ERR_peek_error(), error_buffer, sizeof(error_buffer)));
    return CURLE_OUT_OF_MEMORY;
  }

#ifdef SSL_MODE_RELEASE_BUFFERS
  SSL_CTX_set_mode(BACKEND->ctx, SSL_MODE_RELEASE_BUFFERS);
#endif

#ifdef SSL_CTRL_SET_MSG_CALLBACK
  if(data->set.fdebug && data->set.verbose) {
    /* the SSL trace callback is only used for verbose logging */
    SSL_CTX_set_msg_callback(BACKEND->ctx, ssl_tls_trace);
    SSL_CTX_set_msg_callback_arg(BACKEND->ctx, conn);
  }
#endif

  /* OpenSSL contains code to work-around lots of bugs and flaws in various
     SSL-implementations. SSL_CTX_set_options() is used to enabled those
     work-arounds. The man page for this option states that SSL_OP_ALL enables
     all the work-arounds and that "It is usually safe to use SSL_OP_ALL to
     enable the bug workaround options if compatibility with somewhat broken
     implementations is desired."

     The "-no_ticket" option was introduced in Openssl0.9.8j. It's a flag to
     disable "rfc4507bis session ticket support".  rfc4507bis was later turned
     into the proper RFC5077 it seems: https://tools.ietf.org/html/rfc5077

     The enabled extension concerns the session management. I wonder how often
     libcurl stops a connection and then resumes a TLS session. also, sending
     the session data is some overhead. .I suggest that you just use your
     proposed patch (which explicitly disables TICKET).

     If someone writes an application with libcurl and openssl who wants to
     enable the feature, one can do this in the SSL callback.

     SSL_OP_NETSCAPE_REUSE_CIPHER_CHANGE_BUG option enabling allowed proper
     interoperability with web server Netscape Enterprise Server 2.0.1 which
     was released back in 1996.

     Due to CVE-2010-4180, option SSL_OP_NETSCAPE_REUSE_CIPHER_CHANGE_BUG has
     become ineffective as of OpenSSL 0.9.8q and 1.0.0c. In order to mitigate
     CVE-2010-4180 when using previous OpenSSL versions we no longer enable
     this option regardless of OpenSSL version and SSL_OP_ALL definition.

     OpenSSL added a work-around for a SSL 3.0/TLS 1.0 CBC vulnerability
     (https://www.openssl.org/~bodo/tls-cbc.txt). In 0.9.6e they added a bit to
     SSL_OP_ALL that _disables_ that work-around despite the fact that
     SSL_OP_ALL is documented to do "rather harmless" workarounds. In order to
     keep the secure work-around, the SSL_OP_DONT_INSERT_EMPTY_FRAGMENTS bit
     must not be set.
  */

  ctx_options = SSL_OP_ALL;

#ifdef SSL_OP_NO_TICKET
  ctx_options |= SSL_OP_NO_TICKET;
#endif

#ifdef SSL_OP_NO_COMPRESSION
  ctx_options |= SSL_OP_NO_COMPRESSION;
#endif

#ifdef SSL_OP_NETSCAPE_REUSE_CIPHER_CHANGE_BUG
  /* mitigate CVE-2010-4180 */
  ctx_options &= ~SSL_OP_NETSCAPE_REUSE_CIPHER_CHANGE_BUG;
#endif

#ifdef SSL_OP_DONT_INSERT_EMPTY_FRAGMENTS
  /* unless the user explicitly ask to allow the protocol vulnerability we
     use the work-around */
  if(!SSL_SET_OPTION(enable_beast))
    ctx_options &= ~SSL_OP_DONT_INSERT_EMPTY_FRAGMENTS;
#endif

  switch(ssl_version) {
  case CURL_SSLVERSION_SSLv3:
    ctx_options |= SSL_OP_NO_SSLv2;
    ctx_options |= SSL_OP_NO_TLSv1;
#if OPENSSL_VERSION_NUMBER >= 0x1000100FL
    ctx_options |= SSL_OP_NO_TLSv1_1;
    ctx_options |= SSL_OP_NO_TLSv1_2;
#ifdef TLS1_3_VERSION
    ctx_options |= SSL_OP_NO_TLSv1_3;
#endif
#endif
    break;

  case CURL_SSLVERSION_DEFAULT:
  case CURL_SSLVERSION_TLSv1:
  case CURL_SSLVERSION_TLSv1_0:
  case CURL_SSLVERSION_TLSv1_1:
  case CURL_SSLVERSION_TLSv1_2:
  case CURL_SSLVERSION_TLSv1_3:
    /* asking for any TLS version as the minimum, means no SSL versions
       allowed */
    ctx_options |= SSL_OP_NO_SSLv2;
    ctx_options |= SSL_OP_NO_SSLv3;
    result = set_ssl_version_min_max(&ctx_options, conn, sockindex);
    if(result != CURLE_OK)
       return result;
    break;

  case CURL_SSLVERSION_SSLv2:
    ctx_options |= SSL_OP_NO_SSLv3;
    ctx_options |= SSL_OP_NO_TLSv1;
#if OPENSSL_VERSION_NUMBER >= 0x1000100FL
    ctx_options |= SSL_OP_NO_TLSv1_1;
    ctx_options |= SSL_OP_NO_TLSv1_2;
#ifdef TLS1_3_VERSION
    ctx_options |= SSL_OP_NO_TLSv1_3;
#endif
#endif
    break;

  default:
    failf(data, "Unrecognized parameter passed via CURLOPT_SSLVERSION");
    return CURLE_SSL_CONNECT_ERROR;
  }

  SSL_CTX_set_options(BACKEND->ctx, ctx_options);

#ifdef HAS_NPN
  if(conn->bits.tls_enable_npn)
    SSL_CTX_set_next_proto_select_cb(BACKEND->ctx, select_next_proto_cb, conn);
#endif

#ifdef HAS_ALPN
  if(conn->bits.tls_enable_alpn) {
    int cur = 0;
    unsigned char protocols[128];

#ifdef USE_NGHTTP2
    if(data->set.httpversion >= CURL_HTTP_VERSION_2 &&
       (!SSL_IS_PROXY() || !conn->bits.tunnel_proxy)) {
      protocols[cur++] = NGHTTP2_PROTO_VERSION_ID_LEN;

      memcpy(&protocols[cur], NGHTTP2_PROTO_VERSION_ID,
          NGHTTP2_PROTO_VERSION_ID_LEN);
      cur += NGHTTP2_PROTO_VERSION_ID_LEN;
      infof(data, "ALPN, offering %s\n", NGHTTP2_PROTO_VERSION_ID);
    }
#endif

    protocols[cur++] = ALPN_HTTP_1_1_LENGTH;
    memcpy(&protocols[cur], ALPN_HTTP_1_1, ALPN_HTTP_1_1_LENGTH);
    cur += ALPN_HTTP_1_1_LENGTH;
    infof(data, "ALPN, offering %s\n", ALPN_HTTP_1_1);

    /* expects length prefixed preference ordered list of protocols in wire
     * format
     */
    SSL_CTX_set_alpn_protos(BACKEND->ctx, protocols, cur);
  }
#endif

  if(ssl_cert || ssl_cert_type) {
    if(!cert_stuff(conn, BACKEND->ctx, ssl_cert, ssl_cert_type,
                   SSL_SET_OPTION(key), SSL_SET_OPTION(key_type),
                   SSL_SET_OPTION(key_passwd))) {
      /* failf() is already done in cert_stuff() */
      return CURLE_SSL_CERTPROBLEM;
    }
  }

  ciphers = SSL_CONN_CONFIG(cipher_list);
  if(!ciphers)
    ciphers = (char *)DEFAULT_CIPHER_SELECTION;
  if(ciphers) {
    if(!SSL_CTX_set_cipher_list(BACKEND->ctx, ciphers)) {
      failf(data, "failed setting cipher list: %s", ciphers);
      return CURLE_SSL_CIPHER;
    }
    infof(data, "Cipher selection: %s\n", ciphers);
  }

#ifdef HAVE_SSL_CTX_SET_CIPHERSUITES
  {
    char *ciphers13 = SSL_CONN_CONFIG(cipher_list13);
    if(ciphers13) {
      if(!SSL_CTX_set_ciphersuites(BACKEND->ctx, ciphers13)) {
        failf(data, "failed setting TLS 1.3 cipher suite: %s", ciphers13);
        return CURLE_SSL_CIPHER;
      }
      infof(data, "TLS 1.3 cipher selection: %s\n", ciphers13);
    }
  }
#endif

#ifdef HAVE_SSL_CTX_SET_POST_HANDSHAKE_AUTH
  /* OpenSSL 1.1.1 requires clients to opt-in for PHA */
  SSL_CTX_set_post_handshake_auth(BACKEND->ctx, 1);
#endif

#ifdef USE_TLS_SRP
  if(ssl_authtype == CURL_TLSAUTH_SRP) {
    char * const ssl_username = SSL_SET_OPTION(username);

    infof(data, "Using TLS-SRP username: %s\n", ssl_username);

    if(!SSL_CTX_set_srp_username(BACKEND->ctx, ssl_username)) {
      failf(data, "Unable to set SRP user name");
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if(!SSL_CTX_set_srp_password(BACKEND->ctx, SSL_SET_OPTION(password))) {
      failf(data, "failed setting SRP password");
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if(!SSL_CONN_CONFIG(cipher_list)) {
      infof(data, "Setting cipher list SRP\n");

      if(!SSL_CTX_set_cipher_list(BACKEND->ctx, "SRP")) {
        failf(data, "failed setting SRP cipher list");
        return CURLE_SSL_CIPHER;
      }
    }
  }
#endif

  if(ssl_cafile || ssl_capath) {
    /* tell SSL where to find CA certificates that are used to verify
       the servers certificate. */
    if(!SSL_CTX_load_verify_locations(BACKEND->ctx, ssl_cafile, ssl_capath)) {
      if(verifypeer) {
        /* Fail if we insist on successfully verifying the server. */
        failf(data, "error setting certificate verify locations:\n"
              "  CAfile: %s\n  CApath: %s",
              ssl_cafile ? ssl_cafile : "none",
              ssl_capath ? ssl_capath : "none");
        return CURLE_SSL_CACERT_BADFILE;
      }
      /* Just continue with a warning if no strict  certificate verification
         is required. */
      infof(data, "error setting certificate verify locations,"
            " continuing anyway:\n");
    }
    else {
      /* Everything is fine. */
      infof(data, "successfully set certificate verify locations:\n");
    }
    infof(data,
          "  CAfile: %s\n"
          "  CApath: %s\n",
          ssl_cafile ? ssl_cafile : "none",
          ssl_capath ? ssl_capath : "none");
  }
#ifdef CURL_CA_FALLBACK
  else if(verifypeer) {
    /* verifying the peer without any CA certificates won't
       work so use openssl's built in default as fallback */
    SSL_CTX_set_default_verify_paths(BACKEND->ctx);
  }
#endif

  if(ssl_crlfile) {
    /* tell SSL where to find CRL file that is used to check certificate
     * revocation */
    lookup = X509_STORE_add_lookup(SSL_CTX_get_cert_store(BACKEND->ctx),
                                 X509_LOOKUP_file());
    if(!lookup ||
       (!X509_load_crl_file(lookup, ssl_crlfile, X509_FILETYPE_PEM)) ) {
      failf(data, "error loading CRL file: %s", ssl_crlfile);
      return CURLE_SSL_CRL_BADFILE;
    }
    /* Everything is fine. */
    infof(data, "successfully load CRL file:\n");
    X509_STORE_set_flags(SSL_CTX_get_cert_store(BACKEND->ctx),
                         X509_V_FLAG_CRL_CHECK|X509_V_FLAG_CRL_CHECK_ALL);

    infof(data, "  CRLfile: %s\n", ssl_crlfile);
  }

  /* Try building a chain using issuers in the trusted store first to avoid
  problems with server-sent legacy intermediates.
  Newer versions of OpenSSL do alternate chain checking by default which
  gives us the same fix without as much of a performance hit (slight), so we
  prefer that if available.
  https://rt.openssl.org/Ticket/Display.html?id=3621&user=guest&pass=guest
  */
#if defined(X509_V_FLAG_TRUSTED_FIRST) && !defined(X509_V_FLAG_NO_ALT_CHAINS)
  if(verifypeer) {
    X509_STORE_set_flags(SSL_CTX_get_cert_store(BACKEND->ctx),
                         X509_V_FLAG_TRUSTED_FIRST);
  }
#endif

  /* SSL always tries to verify the peer, this only says whether it should
   * fail to connect if the verification fails, or if it should continue
   * anyway. In the latter case the result of the verification is checked with
   * SSL_get_verify_result() below. */
  SSL_CTX_set_verify(BACKEND->ctx,
                     verifypeer ? SSL_VERIFY_PEER : SSL_VERIFY_NONE, NULL);

  /* Enable logging of secrets to the file specified in env SSLKEYLOGFILE. */
#if defined(ENABLE_SSLKEYLOGFILE) && defined(HAVE_KEYLOG_CALLBACK)
  if(keylog_file_fp) {
    SSL_CTX_set_keylog_callback(BACKEND->ctx, ossl_keylog_callback);
  }
#endif

  /* Enable the session cache because it's a prerequisite for the "new session"
   * callback. Use the "external storage" mode to avoid that OpenSSL creates
   * an internal session cache.
   */
  SSL_CTX_set_session_cache_mode(BACKEND->ctx,
      SSL_SESS_CACHE_CLIENT | SSL_SESS_CACHE_NO_INTERNAL);
  SSL_CTX_sess_set_new_cb(BACKEND->ctx, ossl_new_session_cb);

  /* give application a chance to interfere with SSL set up. */
  if(data->set.ssl.fsslctx) {
    result = (*data->set.ssl.fsslctx)(data, BACKEND->ctx,
                                      data->set.ssl.fsslctxp);
    if(result) {
      failf(data, "error signaled by ssl ctx callback");
      return result;
    }
  }

  /* Lets make an SSL structure */
  if(BACKEND->handle)
    SSL_free(BACKEND->handle);
  BACKEND->handle = SSL_new(BACKEND->ctx);
  if(!BACKEND->handle) {
    failf(data, "SSL: couldn't create a context (handle)!");
    return CURLE_OUT_OF_MEMORY;
  }

#if (OPENSSL_VERSION_NUMBER >= 0x0090808fL) && !defined(OPENSSL_NO_TLSEXT) && \
    !defined(OPENSSL_NO_OCSP)
  if(SSL_CONN_CONFIG(verifystatus))
    SSL_set_tlsext_status_type(BACKEND->handle, TLSEXT_STATUSTYPE_ocsp);
#endif

#if defined(OPENSSL_IS_BORINGSSL) && defined(ALLOW_RENEG)
  SSL_set_renegotiate_mode(BACKEND->handle, ssl_renegotiate_freely);
#endif

  SSL_set_connect_state(BACKEND->handle);

  BACKEND->server_cert = 0x0;
#ifdef SSL_CTRL_SET_TLSEXT_HOSTNAME
  if((0 == Curl_inet_pton(AF_INET, hostname, &addr)) &&
#ifdef ENABLE_IPV6
     (0 == Curl_inet_pton(AF_INET6, hostname, &addr)) &&
#endif
     sni &&
     !SSL_set_tlsext_host_name(BACKEND->handle, hostname))
    infof(data, "WARNING: failed to configure server name indication (SNI) "
          "TLS extension\n");
#endif

  /* Check if there's a cached ID we can/should use here! */
  if(SSL_SET_OPTION(primary.sessionid)) {
    void *ssl_sessionid = NULL;
    int connectdata_idx = ossl_get_ssl_conn_index();
    int sockindex_idx = ossl_get_ssl_sockindex_index();

    if(connectdata_idx >= 0 && sockindex_idx >= 0) {
      /* Store the data needed for the "new session" callback.
       * The sockindex is stored as a pointer to an array element. */
      SSL_set_ex_data(BACKEND->handle, connectdata_idx, conn);
      SSL_set_ex_data(BACKEND->handle, sockindex_idx, conn->sock + sockindex);
    }

    Curl_ssl_sessionid_lock(conn);
    if(!Curl_ssl_getsessionid(conn, &ssl_sessionid, NULL, sockindex)) {
      /* we got a session id, use it! */
      if(!SSL_set_session(BACKEND->handle, ssl_sessionid)) {
        Curl_ssl_sessionid_unlock(conn);
        failf(data, "SSL: SSL_set_session failed: %s",
              ossl_strerror(ERR_get_error(), error_buffer,
                            sizeof(error_buffer)));
        return CURLE_SSL_CONNECT_ERROR;
      }
      /* Informational message */
      infof(data, "SSL re-using session ID\n");
    }
    Curl_ssl_sessionid_unlock(conn);
  }

  if(conn->proxy_ssl[sockindex].use) {
    BIO *const bio = BIO_new(BIO_f_ssl());
    SSL *handle = conn->proxy_ssl[sockindex].backend->handle;
    DEBUGASSERT(ssl_connection_complete == conn->proxy_ssl[sockindex].state);
    DEBUGASSERT(handle != NULL);
    DEBUGASSERT(bio != NULL);
    BIO_set_ssl(bio, handle, FALSE);
    SSL_set_bio(BACKEND->handle, bio, bio);
  }
  else if(!SSL_set_fd(BACKEND->handle, (int)sockfd)) {
    /* pass the raw socket into the SSL layers */
    failf(data, "SSL: SSL_set_fd failed: %s",
          ossl_strerror(ERR_get_error(), error_buffer, sizeof(error_buffer)));
    return CURLE_SSL_CONNECT_ERROR;
  }

  connssl->connecting_state = ssl_connect_2;

  return CURLE_OK;
}